

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.h
# Opt level: O2

void __thiscall
Environment::Update(Environment *this,
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *particles)

{
  pointer pvVar1;
  double *pdVar2;
  long lVar3;
  int i;
  ulong uVar4;
  allocator local_e1;
  int local_e0;
  int local_dc;
  Matx<double,_4,_1> local_d8;
  _InputArray local_b0;
  Point local_98;
  Mat Env;
  
  cv::Matx<double,_4,_1>::Matx(&local_d8);
  local_d8.val[2] = 0.0;
  local_d8.val[3] = 0.0;
  local_d8.val[0] = 0.0;
  local_d8.val[1] = 0.0;
  cv::Mat::Mat(&Env,0x1e0,0x280,0x10,(Scalar_ *)&local_d8);
  local_b0.sz.width = 0;
  local_b0.sz.height = 0;
  local_b0.flags = 0x3010000;
  local_98 = this->goal;
  local_b0.obj = &Env;
  cv::Matx<double,_4,_1>::Matx(&local_d8);
  local_d8.val[0] = 0.0;
  local_d8.val[1] = 255.0;
  local_d8.val[2] = 0.0;
  local_d8.val[3] = 0.0;
  cv::circle(&local_b0,&local_98,8,&local_d8,0xffffffffffffffff,8,0);
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    pvVar1 = (particles->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(particles->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar4)
    break;
    local_b0.sz.width = 0;
    local_b0.sz.height = 0;
    local_b0.flags = 0x3010000;
    local_b0.obj = &Env;
    pdVar2 = *(double **)
              ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data + lVar3);
    local_e0 = (int)ROUND(*pdVar2);
    local_dc = (int)ROUND(pdVar2[1]);
    cv::Matx<double,_4,_1>::Matx(&local_d8);
    local_d8.val[0] = 255.0;
    local_d8.val[1] = 255.0;
    local_d8.val[2] = 255.0;
    local_d8.val[3] = 0.0;
    cv::circle(&local_b0,&local_e0,8,&local_d8,0xffffffff,8,0);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x18;
  }
  std::__cxx11::string::string((string *)&local_d8,"Environment",&local_e1);
  local_b0.sz.width = 0;
  local_b0.sz.height = 0;
  local_b0.flags = 0x1010000;
  local_b0.obj = &Env;
  cv::imshow((string *)&local_d8,&local_b0);
  std::__cxx11::string::~string((string *)&local_d8);
  cv::waitKey(300);
  cv::Mat::~Mat(&Env);
  return;
}

Assistant:

void Environment::Update( vector <vector<double> > particles )
{
    Mat Env( 480, 640, CV_8UC3, Scalar(0, 0, 0) );
    circle( Env, goal, 8.0, Scalar( 0, 255, 0 ), -1, 8 );
    for( int i = 0; i < particles.size(); i++ )
    {
        circle( Env, Point2d( particles[i][0], particles[i][1] ), 8.0, Scalar( 255, 255, 255 ), -1, 8 );
    }
    imshow("Environment", Env);
    waitKey(300);
}